

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O0

int mbedtls_cipher_write_tag(mbedtls_cipher_context_t *ctx,uchar *tag,size_t tag_len)

{
  size_t tag_len_local;
  uchar *tag_local;
  mbedtls_cipher_context_t *ctx_local;
  
  if (((ctx == (mbedtls_cipher_context_t *)0x0) ||
      (ctx->cipher_info == (mbedtls_cipher_info_t *)0x0)) || (tag == (uchar *)0x0)) {
    ctx_local._4_4_ = -0x6100;
  }
  else if (ctx->operation == MBEDTLS_ENCRYPT) {
    if (ctx->cipher_info->mode == MBEDTLS_MODE_GCM) {
      ctx_local._4_4_ = mbedtls_gcm_finish((mbedtls_gcm_context *)ctx->cipher_ctx,tag,tag_len);
    }
    else {
      ctx_local._4_4_ = 0;
    }
  }
  else {
    ctx_local._4_4_ = -0x6100;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_cipher_write_tag( mbedtls_cipher_context_t *ctx,
                      unsigned char *tag, size_t tag_len )
{
    if( NULL == ctx || NULL == ctx->cipher_info || NULL == tag )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    if( MBEDTLS_ENCRYPT != ctx->operation )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    if( MBEDTLS_MODE_GCM == ctx->cipher_info->mode )
        return mbedtls_gcm_finish( (mbedtls_gcm_context *) ctx->cipher_ctx, tag, tag_len );

    return( 0 );
}